

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

void NscPushElementAccess(CNscPStackEntry *pOut,CNscPStackEntry *pStruct,NscType nType,int nElement)

{
  uint *puVar1;
  uchar *puVar2;
  uchar *puVar3;
  bool bVar4;
  
  bVar4 = CNscPStackEntry::IsSimpleVariable(pStruct);
  if (bVar4) {
    puVar2 = pStruct->m_pauchData;
    CNscPStackEntry::PushVariable
              (pOut,nType,*(NscType *)(puVar2 + 0xc),*(size_t *)(puVar2 + 0x18),nElement,
               *(int *)(puVar2 + 0x24),*(UINT32 *)(puVar2 + 0x28));
    puVar3 = (g_pCtx->m_sSymbols).m_pauchData;
    if (puVar3 == (uchar *)0x0) {
      __assert_fail("pSymbol",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x16d,
                    "void NscPushElementAccess(CNscPStackEntry *, CNscPStackEntry *, NscType, int)")
      ;
    }
    puVar1 = (uint *)(puVar3 + *(long *)(puVar2 + 0x18) + 0x24);
    *puVar1 = *puVar1 | 0x4000000;
  }
  else {
    CNscPStackEntry::PushElement
              (pOut,nType,pStruct->m_nType,nElement,pStruct->m_pauchData,pStruct->m_nDataSize);
  }
  CNscPStackEntry::SetType(pOut,nType);
  if (0x1f < (int)nType) {
    CNscContext::GenerateMessage(g_pCtx,NscMessage_WarningNestedStructAccess);
    return;
  }
  return;
}

Assistant:

void NscPushElementAccess (CNscPStackEntry *pOut, 
	CNscPStackEntry *pStruct, NscType nType, int nElement)
{

	//
	// If this is a simple variable
	//

	if (pStruct ->IsSimpleVariable ())
	{
		NscPCodeVariable *pv = (NscPCodeVariable *) pStruct ->GetData ();
		pOut ->PushVariable (nType, pv ->nType, pv ->nSymbol, nElement, 
			pv ->nStackOffset, pv ->ulFlags);

		NscSymbol *pSymbol = g_pCtx ->GetSymbol (pv ->nSymbol);
		assert (pSymbol);

		NscParserReferenceSymbol (pSymbol);
	}

	//
	// Otherwise, we need to do an element access
	//

	else
	{
		pOut ->PushElement (nType, pStruct ->GetType (), nElement,
			pStruct ->GetData (), pStruct ->GetDataSize ());
	}

	//
	// Set the return type
	//

	pOut ->SetType (nType);

	//
	// If we are accessing an element that is also a structure, emit a warning
	// as this does not work correctly with the standard compiler
	//

	if (nType >= NscType_Struct_0)
	{
		g_pCtx ->GenerateMessage (NscMessage_WarningNestedStructAccess);
	}
}